

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O3

void __thiscall
duckdb::MetadataManager::ConvertToTransient(MetadataManager *this,MetadataBlock *metadata_block)

{
  data_ptr_t __src;
  BlockManager *pBVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BlockHandle *__tmp;
  idx_t iVar2;
  idx_t iVar3;
  BufferHandle new_buffer;
  BufferHandle old_buffer;
  BufferHandle local_70;
  data_ptr_t local_58;
  element_type *local_50;
  BufferHandle local_48;
  
  (*this->buffer_manager->_vptr_BufferManager[7])(&local_48,this->buffer_manager,metadata_block);
  (*this->buffer_manager->_vptr_BufferManager[5])
            (&local_70,this->buffer_manager,7,this->block_manager,0);
  local_50 = local_70.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_70.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_70.handle.internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_70.node);
  local_58 = (local_70.node.ptr)->buffer;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
  __src = (local_48.node.ptr)->buffer;
  pBVar1 = this->block_manager;
  iVar2 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar3 = optional_idx::GetIndex(&pBVar1->block_header_size);
  switchD_012b9b0d::default(local_58,__src,iVar2 - iVar3);
  (metadata_block->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
  this_00 = (metadata_block->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (metadata_block->block).internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_70.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  BlockManager::UnregisterBlock(this->block_manager,metadata_block->block_id);
  BufferHandle::~BufferHandle(&local_70);
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void MetadataManager::ConvertToTransient(MetadataBlock &metadata_block) {
	// pin the old block
	auto old_buffer = buffer_manager.Pin(metadata_block.block);

	// allocate a new transient block to replace it
	auto new_buffer = buffer_manager.Allocate(MemoryTag::METADATA, &block_manager, false);
	auto new_block = new_buffer.GetBlockHandle();

	// copy the data to the transient block
	memcpy(new_buffer.Ptr(), old_buffer.Ptr(), block_manager.GetBlockSize());
	metadata_block.block = std::move(new_block);

	// unregister the old block
	block_manager.UnregisterBlock(metadata_block.block_id);
}